

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::traversedashwordlistdashfindfirst(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  pointer pDVar1;
  bool bVar2;
  uint uVar3;
  pointer pDVar4;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDFIRST");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  pDVar1 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pDVar4 == pDVar1) {
      ForthStack<unsigned_int>::setTop(this_00,0);
      return;
    }
    bVar2 = false;
    if (((pDVar4[-1].flags & pDVar4[-1].FlagHidden) == 0) &&
       (bVar2 = false, pDVar4[-1].searchOrder == uVar3)) {
      ForthStack<unsigned_int>::setTop(this_00,pDVar4[-1].numberInVector);
      bVar2 = true;
    }
    if (bVar2) break;
    pDVar4 = pDVar4 + -1;
  }
  return;
}

Assistant:

void traversedashwordlistdashfindfirst(){
							REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDFIRST");
							auto wid = dStack.getTop(); 
							for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
								auto& defnLook = *i;
								//if (!defn.isFindable())
								if (defnLook.isHidden())
									continue;
								if(defnLook.searchOrder==wid){
									dStack.setTop(defnLook.numberInVector);
									return;
								}
							}
							dStack.setTop(0);	
		}